

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * __thiscall Pathie::Path::relative(Path *__return_storage_ptr__,Path *this,Path *base)

{
  char cVar1;
  bool bVar2;
  __type _Var3;
  invalid_argument *piVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  string local_1c8 [32];
  string local_1a8 [32];
  ulong local_188;
  size_t i;
  undefined1 local_160 [8];
  Path basepart;
  string resultstr;
  size_t reflength;
  size_t baselength;
  size_t pos;
  undefined4 local_e8;
  allocator local_e1;
  string local_e0 [32];
  undefined1 local_c0 [8];
  Path refpath;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  allocator local_41;
  string local_40 [32];
  Path *local_20;
  Path *base_local;
  Path *this_local;
  
  local_20 = base;
  base_local = this;
  this_local = __return_storage_ptr__;
  bVar2 = is_relative(this);
  if (bVar2) {
    local_55 = 1;
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Referenced path must be absolute.",&local_41);
    std::invalid_argument::invalid_argument(piVar4,local_40);
    local_55 = 0;
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar2 = is_relative(base);
  if (bVar2) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Argument path must be absolute.",&local_79);
    std::invalid_argument::invalid_argument(piVar4,local_78);
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  prune((Path *)&refpath.field_0x18,base);
  operator=(base,(Path *)&refpath.field_0x18);
  ~Path((Path *)&refpath.field_0x18);
  prune((Path *)local_c0,this);
  _Var3 = std::operator==(&base->m_path,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_c0);
  if (_Var3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,".",&local_e1);
    Path(__return_storage_ptr__,(string *)local_e0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    local_e8 = 1;
  }
  else {
    bVar2 = is_root(base);
    if (bVar2) {
      std::__cxx11::string::substr((ulong)&pos,(ulong)local_c0);
      Path(__return_storage_ptr__,(string *)&pos);
      std::__cxx11::string::~string((string *)&pos);
      local_e8 = 1;
    }
    else {
      baselength = 0;
      uVar5 = std::__cxx11::string::length();
      uVar6 = std::__cxx11::string::length();
      for (; (baselength < uVar5 && (baselength < uVar6)); baselength = baselength + 1) {
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)base);
        cVar1 = *pcVar7;
        pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_c0);
        if (cVar1 != *pcVar7) break;
      }
      std::__cxx11::string::string((string *)&basepart.field_0x18);
      std::__cxx11::string::substr((ulong)&i,(ulong)base);
      Path((Path *)local_160,(string *)&i);
      std::__cxx11::string::~string((string *)&i);
      for (local_188 = 0; uVar5 = local_188, sVar8 = component_count((Path *)local_160),
          uVar5 < sVar8; local_188 = local_188 + 1) {
        std::__cxx11::string::append(&basepart.field_0x18);
      }
      std::__cxx11::string::substr((ulong)local_1a8,(ulong)local_c0);
      std::__cxx11::string::append((string *)&basepart.field_0x18);
      std::__cxx11::string::~string(local_1a8);
      std::__cxx11::string::string(local_1c8,(string *)&basepart.field_0x18);
      Path(__return_storage_ptr__,(string *)local_1c8);
      std::__cxx11::string::~string(local_1c8);
      local_e8 = 1;
      ~Path((Path *)local_160);
      std::__cxx11::string::~string((string *)&basepart.field_0x18);
    }
  }
  ~Path((Path *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

Path Path::relative(Path base) const
{
  if (is_relative())
    throw(std::invalid_argument("Referenced path must be absolute."));
  if (base.is_relative())
    throw(std::invalid_argument("Argument path must be absolute."));

  // Wipe all ".." and ".", this would break the below algorithm
  base = base.prune();
  Path refpath = prune();

  // Shortcut for equal paths
  if (base.m_path == refpath.m_path)
    return Path(".");

  // Shortcut if base is the root
  if (base.is_root()) {
#if defined(_PATHIE_UNIX)
    return Path(refpath.m_path.substr(1)); // Skip leading /
#elif defined(_WIN32)
    return Path(refpath.m_path.substr(root().m_path.length())); // Skip leading / or X:/
#else
#error Unsupported system.
#endif
  }

  size_t pos = 0;
  size_t baselength = base.m_path.length();
  size_t reflength  = refpath.m_path.length();
  while (true) {
    if (pos >= baselength)
      break;
    else if (pos >= reflength)
      break;
    else if (base.m_path[pos] != refpath.m_path[pos])
      break;
    else
      pos++;
  }
  // pos now points to the last character in which both strings were equal

  // For each component in base that is not part of refpath, add a "..".
  std::string resultstr;
  Path basepart(base.m_path.substr(pos));
  for(size_t i=0; i < basepart.component_count(); i++)
    resultstr.append("../");

  // Now append the part of refpath that is not part of base to the result.
  resultstr.append(refpath.m_path.substr(pos));

  // Done.
  return Path(resultstr);
}